

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# foreign_key_constraint.cpp
# Opt level: O1

void __thiscall duckdb::ForeignKeyConstraint::ForeignKeyConstraint(ForeignKeyConstraint *this)

{
  Constraint::Constraint(&this->super_Constraint,FOREIGN_KEY);
  (this->super_Constraint)._vptr_Constraint = (_func_int **)&PTR__ForeignKeyConstraint_019afc78;
  (this->pk_columns).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pk_columns).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->pk_columns).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->fk_columns).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->fk_columns).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->fk_columns).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->info).schema._M_dataplus._M_p = (pointer)&(this->info).schema.field_2;
  (this->info).schema._M_string_length = 0;
  (this->info).schema.field_2._M_local_buf[0] = '\0';
  (this->info).table._M_dataplus._M_p = (pointer)&(this->info).table.field_2;
  (this->info).table._M_string_length = 0;
  (this->info).table.field_2._M_local_buf[0] = '\0';
  (this->info).pk_keys.super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
  super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->info).pk_keys.super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
  super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->info).pk_keys.super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
  super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->info).fk_keys.super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
  super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->info).fk_keys.super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
  super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->info).fk_keys.super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
  super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

ForeignKeyConstraint::ForeignKeyConstraint() : Constraint(ConstraintType::FOREIGN_KEY) {
}